

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10ValidPolicyMappingTest5Subpart2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section10ValidPolicyMappingTest5Subpart2
          (Section10ValidPolicyMappingTest5Subpart2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10ValidPolicyMappingTest5Subpart2) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "P1Mapping1to234CACert",
      "P1Mapping1to234subCACert", "ValidPolicyMappingTest5EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "P1Mapping1to234CACRL",
                              "P1Mapping1to234subCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.5";
  info.should_validate = false;
  info.SetInitialPolicySet("NIST-test-policy-6");
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}